

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

ElabSystemTaskKind slang::ast::SemanticFacts::getElabSystemTaskKind(Token token)

{
  int iVar1;
  size_t sVar2;
  char *__s1;
  size_type __rlen;
  string_view sVar3;
  Token local_20;
  
  sVar3 = parsing::Token::valueText(&local_20);
  __s1 = sVar3._M_str;
  sVar2 = sVar3._M_len;
  if (sVar2 == 6) {
    iVar1 = bcmp(__s1,"$fatal",6);
    if (iVar1 == 0) {
      return Fatal;
    }
    iVar1 = bcmp(__s1,"$error",6);
    if (iVar1 == 0) {
      return Error;
    }
  }
  if (sVar2 == 5) {
    iVar1 = bcmp(__s1,"$info",5);
    if (iVar1 == 0) {
      return Info;
    }
  }
  else if ((sVar2 == 8) && (iVar1 = bcmp(__s1,"$warning",8), iVar1 == 0)) {
    return Warning;
  }
  return StaticAssert;
}

Assistant:

ElabSystemTaskKind SemanticFacts::getElabSystemTaskKind(Token token) {
    auto name = token.valueText();
    if (name == "$fatal"sv)
        return ElabSystemTaskKind::Fatal;
    if (name == "$error"sv)
        return ElabSystemTaskKind::Error;
    if (name == "$warning"sv)
        return ElabSystemTaskKind::Warning;
    if (name == "$info"sv)
        return ElabSystemTaskKind::Info;
    if (name == "$static_assert"sv)
        return ElabSystemTaskKind::StaticAssert;
    SLANG_UNREACHABLE;
}